

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::getQuadratureWeights<(TasGrid::RuleLocal::erule)4>
          (GridLocalPolynomial *this,double *weights)

{
  allocator<double> *this_00;
  value_type vVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  int *piVar7;
  double dVar8;
  iterator iVar9;
  reference rVar10;
  _Bit_iterator __first;
  _Bit_iterator __last;
  bool local_255;
  Data2D<int> *local_220;
  MultiIndexSet *local_1f0;
  reference local_1e0;
  int local_1cc;
  int *piStack_1c8;
  int j_1;
  int *func;
  _Bit_type local_1b8;
  int local_1ac;
  int local_1a8;
  int branch;
  int current;
  uint local_198;
  _Bit_type *local_190;
  uint local_188;
  _Bit_type *local_180;
  uint local_178;
  _Bit_type *local_170;
  uint local_168;
  int local_15c;
  int *piStack_158;
  int j;
  int *pnt;
  int local_148;
  int i;
  int l;
  vector<bool,_std::allocator<bool>_> used;
  undefined1 local_110 [8];
  vector<double,_std::allocator<double>_> node;
  undefined1 local_f0 [4];
  int max_parents;
  vector<int,_std::allocator<int>_> level;
  int num_points;
  Data2D<int> *dagUp;
  undefined1 local_a0 [8];
  Data2D<int> lparents;
  double basis_value;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> monkey_tail;
  allocator<int> local_39;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> monkey_count;
  MultiIndexSet *work;
  double *weights_local;
  GridLocalPolynomial *this_local;
  
  bVar2 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (bVar2) {
    local_1f0 = &(this->super_BaseCanonicalGrid).needed;
  }
  else {
    local_1f0 = &(this->super_BaseCanonicalGrid).points;
  }
  monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_1f0;
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x23])(this,weights);
  iVar3 = this->top_level;
  ::std::allocator<int>::allocator(&local_39);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,(long)(iVar3 + 1),&local_39);
  ::std::allocator<int>::~allocator(&local_39);
  iVar3 = this->top_level;
  ::std::allocator<int>::allocator((allocator<int> *)((long)&basis_value + 7));
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,(long)(iVar3 + 1),
             (allocator<int> *)((long)&basis_value + 7));
  ::std::allocator<int>::~allocator((allocator<int> *)((long)&basis_value + 7));
  Data2D<int>::Data2D((Data2D<int> *)local_a0);
  iVar3 = Data2D<int>::getNumStrips(&this->parents);
  iVar4 = MultiIndexSet::getNumIndexes
                    ((MultiIndexSet *)
                     monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (iVar3 != iVar4) {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)4>
              ((Data2D<int> *)&dagUp,
               (MultiIndexSet *)
               monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    Data2D<int>::operator=((Data2D<int> *)local_a0,(Data2D<int> *)&dagUp);
    Data2D<int>::~Data2D((Data2D<int> *)&dagUp);
  }
  iVar3 = Data2D<int>::getNumStrips(&this->parents);
  iVar4 = MultiIndexSet::getNumIndexes
                    ((MultiIndexSet *)
                     monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (iVar3 == iVar4) {
    local_220 = &this->parents;
  }
  else {
    local_220 = (Data2D<int> *)local_a0;
  }
  level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ =
       MultiIndexSet::getNumIndexes
                 ((MultiIndexSet *)
                  monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)4>
            ((vector<int,_std::allocator<int>_> *)local_f0,
             (MultiIndexSet *)
             monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  iVar3 = RuleLocal::getMaxNumParents<(TasGrid::RuleLocal::erule)4>();
  node.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = iVar3 * (this->super_BaseCanonicalGrid).num_dimensions;
  iVar3 = (this->super_BaseCanonicalGrid).num_dimensions;
  this_00 = (allocator<double> *)
            ((long)&used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                    ._M_end_of_storage + 7);
  ::std::allocator<double>::allocator(this_00);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_110,(long)iVar3,this_00);
  ::std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7));
  iVar3 = MultiIndexSet::getNumIndexes
                    ((MultiIndexSet *)
                     monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  i._3_1_ = 0;
  ::std::allocator<bool>::allocator((allocator<bool> *)((long)&i + 2));
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&l,(long)iVar3,(bool *)((long)&i + 3),
             (allocator<bool> *)((long)&i + 2));
  ::std::allocator<bool>::~allocator((allocator<bool> *)((long)&i + 2));
  for (local_148 = this->top_level; 0 < local_148; local_148 = local_148 + -1) {
    for (pnt._4_4_ = 0;
        pnt._4_4_ <
        level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; pnt._4_4_ = pnt._4_4_ + 1) {
      pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_f0,(long)pnt._4_4_);
      if (*pvVar5 == local_148) {
        piStack_158 = MultiIndexSet::getIndex
                                ((MultiIndexSet *)
                                 monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,pnt._4_4_);
        for (local_15c = 0; local_15c < (this->super_BaseCanonicalGrid).num_dimensions;
            local_15c = local_15c + 1) {
          dVar8 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)4>(piStack_158[local_15c]);
          pvVar6 = ::std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_110,(long)local_15c);
          *pvVar6 = dVar8;
        }
        iVar9 = ::std::vector<bool,_std::allocator<bool>_>::begin
                          ((vector<bool,_std::allocator<bool>_> *)&l);
        local_180 = iVar9.super__Bit_iterator_base._M_p;
        local_178 = iVar9.super__Bit_iterator_base._M_offset;
        local_170 = local_180;
        local_168 = local_178;
        iVar9 = ::std::vector<bool,_std::allocator<bool>_>::end
                          ((vector<bool,_std::allocator<bool>_> *)&l);
        _current = iVar9.super__Bit_iterator_base._M_p;
        local_198 = iVar9.super__Bit_iterator_base._M_offset;
        branch._3_1_ = 0;
        __first.super__Bit_iterator_base._M_offset = local_168;
        __first.super__Bit_iterator_base._M_p = local_170;
        __first.super__Bit_iterator_base._12_4_ = 0;
        __last.super__Bit_iterator_base._12_4_ = 0;
        __last.super__Bit_iterator_base._M_p =
             (_Bit_type *)SUB128(iVar9.super__Bit_iterator_base._0_12_,0);
        __last.super__Bit_iterator_base._M_offset = SUB124(iVar9.super__Bit_iterator_base._0_12_,8);
        local_190 = _current;
        local_188 = local_198;
        ::std::fill<std::_Bit_iterator,bool>(__first,__last,(bool *)((long)&branch + 3));
        pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_38,0);
        vVar1 = pnt._4_4_;
        *pvVar5 = 0;
        pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_68,0);
        *pvVar5 = vVar1;
        local_1a8 = 0;
        while( true ) {
          pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_38,0);
          if (node.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ <= *pvVar5) break;
          pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_38,(long)local_1a8);
          if (*pvVar5 < node.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_) {
            pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_68,(long)local_1a8);
            piVar7 = Data2D<int>::getStrip(local_220,*pvVar5);
            pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_38,(long)local_1a8);
            local_1ac = piVar7[*pvVar5];
            local_255 = true;
            if (local_1ac != -1) {
              rVar10 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)&l,(long)local_1ac);
              local_1b8 = rVar10._M_mask;
              func = (int *)rVar10._M_p;
              local_255 = ::std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&func);
            }
            if (local_255 == false) {
              piStack_1c8 = MultiIndexSet::getIndex
                                      ((MultiIndexSet *)
                                       monkey_count.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage,local_1ac);
              iVar3 = this->order;
              iVar4 = *piStack_1c8;
              pvVar6 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)local_110,0);
              lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)4>(iVar3,iVar4,*pvVar6);
              for (local_1cc = 1; local_1cc < (this->super_BaseCanonicalGrid).num_dimensions;
                  local_1cc = local_1cc + 1) {
                iVar3 = this->order;
                iVar4 = piStack_1c8[local_1cc];
                pvVar6 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)local_110,
                                    (long)local_1cc);
                dVar8 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)4>(iVar3,iVar4,*pvVar6);
                lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)(dVar8 * (double)lparents.vec.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_end_of_storage);
              }
              weights[local_1ac] =
                   weights[local_1ac] -
                   weights[pnt._4_4_] *
                   (double)lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              rVar10 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)&l,(long)local_1ac);
              local_1e0 = rVar10;
              ::std::_Bit_reference::operator=(&local_1e0,true);
              local_1a8 = local_1a8 + 1;
              pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_38,(long)local_1a8);
              iVar3 = local_1ac;
              *pvVar5 = 0;
              pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_68,(long)local_1a8);
              *pvVar5 = iVar3;
            }
            else {
              pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_38,(long)local_1a8);
              *pvVar5 = *pvVar5 + 1;
            }
          }
          else {
            local_1a8 = local_1a8 + -1;
            pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_38,(long)local_1a8);
            *pvVar5 = *pvVar5 + 1;
          }
        }
      }
    }
  }
  ::std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&l);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_110);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_f0);
  Data2D<int>::~Data2D((Data2D<int> *)local_a0);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return;
}

Assistant:

void GridLocalPolynomial::getQuadratureWeights(double *weights) const{
    const MultiIndexSet &work = (points.empty()) ? needed : points;
    integrateHierarchicalFunctions(weights);

    std::vector<int> monkey_count(top_level+1);
    std::vector<int> monkey_tail(top_level+1);

    double basis_value;

    Data2D<int> lparents;
    if (parents.getNumStrips() != work.getNumIndexes())
        lparents = HierarchyManipulations::computeDAGup<effrule>(work);

    const Data2D<int> &dagUp = (parents.getNumStrips() != work.getNumIndexes()) ? lparents : parents;

    int num_points = work.getNumIndexes();
    std::vector<int> level = HierarchyManipulations::computeLevels<effrule>(work);

    int max_parents = RuleLocal::getMaxNumParents<effrule>() * num_dimensions;

    std::vector<double> node(num_dimensions);
    std::vector<bool> used(work.getNumIndexes(), false);

    for(int l=top_level; l>0; l--){
        for(int i=0; i<num_points; i++){
            if (level[i] == l){
                int const *pnt = work.getIndex(i);
                for(int j=0; j<num_dimensions; j++)
                    node[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                monkey_count[0] = 0;
                monkey_tail[0] = i;
                int current = 0;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            const int *func = work.getIndex(branch);
                            basis_value = RuleLocal::evalRaw<effrule>(order, func[0], node[0]);
                            for(int j=1; j<num_dimensions; j++) basis_value *= RuleLocal::evalRaw<effrule>(order, func[j], node[j]);
                            weights[branch] -= weights[i] * basis_value;
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}